

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

uint32_t hash_string_obj(ObjString *string)

{
  uint32_t hash;
  ObjString *string_local;
  
  if ((string->hashed & 1U) == 0) {
    string_local._4_4_ = hash_string(string->start,string->length);
    string->hash = string_local._4_4_;
    string->hashed = true;
  }
  else {
    string_local._4_4_ = string->hash;
  }
  return string_local._4_4_;
}

Assistant:

uint32_t hash_string_obj(ObjString *string) {
    if (string->hashed) {
        return string->hash;
    }

    uint32_t hash = hash_string(string->start, string->length);

    string->hash = hash;
    string->hashed = true;

    return hash;
}